

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *in_00;
  long lVar3;
  ulong uVar4;
  delim_c local_91;
  size_type n;
  vector<double,_std::allocator<double>_> P_new;
  param_type local_68;
  double p;
  
  P_new.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  P_new.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  P_new.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x28;
  pbVar2 = utility::operator>>(in,(delim_c *)&local_68);
  in_00 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_91.c = ' ';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_91);
  for (uVar4 = 1; uVar4 - 1 < n; uVar4 = uVar4 + 1) {
    std::istream::_M_extract<double>((double *)in);
    if (uVar4 < n) {
      local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0x20;
      utility::operator>>(in,(delim_c *)&local_68);
    }
    std::vector<double,_std::allocator<double>_>::push_back(&P_new,&p);
  }
  local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x29;
  utility::operator>>(in,(delim_c *)&local_68);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    discrete_dist::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_68,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               P_new.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               P_new.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    discrete_dist::param_type::operator=(P,&local_68);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_68);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&P_new.super__Vector_base<double,_std::allocator<double>_>);
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   discrete_dist::param_type &P) {
    double p;
    std::vector<double>::size_type n;
    std::vector<double> P_new;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> n >> utility::delim(' ');
    for (std::vector<double>::size_type i{0}; i < n; ++i) {
      in >> p;
      if (i + 1 < n)
        in >> utility::delim(' ');
      P_new.push_back(p);
    }
    in >> utility::delim(')');
    if (in)
      P = discrete_dist::param_type(P_new.begin(), P_new.end());
    in.flags(flags);
    return in;
  }